

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeMergeEngineInit(SortSubtask *pTask,MergeEngine *pMerger,int eMode)

{
  i64 iVar1;
  int in_EDX;
  PmaReader *in_RSI;
  PmaReader *in_RDI;
  int nTree;
  int i;
  int rc;
  int local_24;
  int local_20;
  
  in_RSI->iEof = (i64)in_RDI;
  iVar1 = in_RSI->iReadOff;
  local_24 = 0;
  while( true ) {
    if ((int)iVar1 <= local_24) {
      local_24 = (int)in_RSI->iReadOff;
      while (local_24 = local_24 + -1, 0 < local_24) {
        vdbeMergeEngineCompare(pMerger,eMode);
      }
      return (uint)*(byte *)((long)&in_RDI->pFd[3].pMethods + 7);
    }
    if (in_EDX == 2) {
      local_20 = vdbePmaReaderNext(in_RSI);
    }
    else {
      local_20 = vdbePmaReaderIncrInit(in_RDI,(int)((ulong)in_RSI >> 0x20));
    }
    if (local_20 != 0) break;
    local_24 = local_24 + 1;
  }
  return local_20;
}

Assistant:

static int vdbeMergeEngineInit(
  SortSubtask *pTask,             /* Thread that will run pMerger */
  MergeEngine *pMerger,           /* MergeEngine to initialize */
  int eMode                       /* One of the INCRINIT_XXX constants */
){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* For looping over PmaReader objects */
  int nTree;                      /* Number of subtrees to merge */

  /* Failure to allocate the merge would have been detected prior to
  ** invoking this routine */
  assert( pMerger!=0 );

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  /* Verify that the MergeEngine is assigned to a single thread */
  assert( pMerger->pTask==0 );
  pMerger->pTask = pTask;

  nTree = pMerger->nTree;
  for(i=0; i<nTree; i++){
    if( SQLITE_MAX_WORKER_THREADS>0 && eMode==INCRINIT_ROOT ){
      /* PmaReaders should be normally initialized in order, as if they are
      ** reading from the same temp file this makes for more linear file IO.
      ** However, in the INCRINIT_ROOT case, if PmaReader aReadr[nTask-1] is
      ** in use it will block the vdbePmaReaderNext() call while it uses
      ** the main thread to fill its buffer. So calling PmaReaderNext()
      ** on this PmaReader before any of the multi-threaded PmaReaders takes
      ** better advantage of multi-processor hardware. */
      rc = vdbePmaReaderNext(&pMerger->aReadr[nTree-i-1]);
    }else{
      rc = vdbePmaReaderIncrInit(&pMerger->aReadr[i], INCRINIT_NORMAL);
    }
    if( rc!=SQLITE_OK ) return rc;
  }

  for(i=pMerger->nTree-1; i>0; i--){
    vdbeMergeEngineCompare(pMerger, i);
  }
  return pTask->pUnpacked->errCode;
}